

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nth_valueStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  int iVar1;
  double *pdVar2;
  sqlite3_value *psVar3;
  double dVar4;
  double fVal;
  i64 iVal;
  NthValueCtx *p;
  sqlite3_value **apArg_local;
  int nArg_local;
  sqlite3_context *pCtx_local;
  
  pdVar2 = (double *)sqlite3_aggregate_context(pCtx,0x10);
  if (pdVar2 == (double *)0x0) {
    return;
  }
  iVar1 = sqlite3_value_numeric_type(apArg[1]);
  if (iVar1 == 1) {
    fVal = (double)sqlite3_value_int64(apArg[1]);
  }
  else {
    if (iVar1 != 2) goto LAB_001ca4a3;
    dVar4 = sqlite3_value_double(apArg[1]);
    if (((double)(long)dVar4 != dVar4) || (NAN((double)(long)dVar4) || NAN(dVar4)))
    goto LAB_001ca4a3;
    fVal = (double)(long)dVar4;
  }
  if (0 < (long)fVal) {
    *pdVar2 = (double)((long)*pdVar2 + 1);
    if (fVal != *pdVar2) {
      return;
    }
    psVar3 = sqlite3_value_dup(*apArg);
    pdVar2[1] = (double)psVar3;
    if (pdVar2[1] != 0.0) {
      return;
    }
    sqlite3_result_error_nomem(pCtx);
    return;
  }
LAB_001ca4a3:
  sqlite3_result_error(pCtx,"second argument to nth_value must be a positive integer",-1);
  return;
}

Assistant:

static void nth_valueStepFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct NthValueCtx *p;
  p = (struct NthValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    i64 iVal;
    switch( sqlite3_value_numeric_type(apArg[1]) ){
      case SQLITE_INTEGER:
        iVal = sqlite3_value_int64(apArg[1]);
        break;
      case SQLITE_FLOAT: {
        double fVal = sqlite3_value_double(apArg[1]);
        if( ((i64)fVal)!=fVal ) goto error_out;
        iVal = (i64)fVal;
        break;
      }
      default:
        goto error_out;
    }
    if( iVal<=0 ) goto error_out;

    p->nStep++;
    if( iVal==p->nStep ){
      p->pValue = sqlite3_value_dup(apArg[0]);
      if( !p->pValue ){
        sqlite3_result_error_nomem(pCtx);
      }
    }
  }
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
  return;

 error_out:
  sqlite3_result_error(
      pCtx, "second argument to nth_value must be a positive integer", -1
  );
}